

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UBool __thiscall icu_63::TZEnumeration::getID(TZEnumeration *this,int32_t i,UErrorCode *ec)

{
  UResourceBundle *pUVar1;
  UChar *pUVar2;
  __off_t __length;
  int32_t idLen;
  ConstChar16Ptr local_80;
  UChar *local_78;
  UnicodeString local_68;
  
  idLen = 0;
  pUVar1 = ures_openDirect_63((char *)0x0,"zoneinfo64",ec);
  pUVar1 = ures_getByKey_63(pUVar1,"Names",pUVar1,ec);
  pUVar2 = ures_getStringByIndex_63(pUVar1,i,&idLen,ec);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    local_80.p_ = pUVar2;
    UnicodeString::UnicodeString(&local_68,'\x01',&local_80,idLen);
    UnicodeString::fastCopyFrom(&(this->super_StringEnumeration).unistr,&local_68);
    UnicodeString::~UnicodeString(&local_68);
    local_78 = local_80.p_;
  }
  else {
    UnicodeString::truncate(&(this->super_StringEnumeration).unistr,(char *)0x0,__length);
  }
  ures_close_63(pUVar1);
  return *ec < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool getID(int32_t i, UErrorCode& ec) {
        int32_t idLen = 0;
        const UChar* id = NULL;
        UResourceBundle *top = ures_openDirect(0, kZONEINFO, &ec);
        top = ures_getByKey(top, kNAMES, top, &ec); // dereference Zones section
        id = ures_getStringByIndex(top, i, &idLen, &ec);
        if(U_FAILURE(ec)) {
            unistr.truncate(0);
        }
        else {
            unistr.fastCopyFrom(UnicodeString(TRUE, id, idLen));
        }
        ures_close(top);
        return U_SUCCESS(ec);
    }